

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inputs.cpp
# Opt level: O2

void __thiscall helics::Input::setDefaultBytes(Input *this,data_view *val)

{
  ValueFederate *this_00;
  data_view local_38;
  
  this_00 = this->fed;
  local_38.dblock._M_len = (val->dblock)._M_len;
  local_38.dblock._M_str = (val->dblock)._M_str;
  local_38.ref.super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (val->ref).super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_38.ref.super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (val->ref).super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (val->ref).super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (val->ref).super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  helics::ValueFederate::setDefaultValue(this_00,this,&local_38);
  CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_38.ref.super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  return;
}

Assistant:

void Input::setDefaultBytes(data_view val)
{
    fed->setDefaultValue(*this, std::move(val));
}